

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O0

int cvNlsInitSensStg(CVodeMem cvode_mem)

{
  int iVar1;
  CVodeMem in_RDI;
  int retval;
  int local_14;
  int local_4;
  
  if (in_RDI->cv_lsetup ==
      (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0) {
    local_14 = SUNNonlinSolSetLSetupFn(in_RDI->NLSstg,0);
  }
  else {
    local_14 = SUNNonlinSolSetLSetupFn(in_RDI->NLSstg,cvNlsLSetupSensStg);
  }
  if (local_14 == 0) {
    if (in_RDI->cv_lsolve == (_func_int_CVodeMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
      local_14 = SUNNonlinSolSetLSolveFn(in_RDI->NLSstg,0);
    }
    else {
      local_14 = SUNNonlinSolSetLSolveFn(in_RDI->NLSstg,cvNlsLSolveSensStg);
    }
    if (local_14 == 0) {
      iVar1 = SUNNonlinSolInitialize(in_RDI->NLSstg);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,0xe6,"cvNlsInitSensStg",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                       ,"The nonlinear solver\'s init routine failed.");
        local_4 = -0xd;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,0xdc,"cvNlsInitSensStg",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                     ,"Setting linear solver solve function failed");
      local_4 = -0xd;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0xce,"cvNlsInitSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"Setting the linear solver setup function failed");
    local_4 = -0xd;
  }
  return local_4;
}

Assistant:

int cvNlsInitSensStg(CVodeMem cvode_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (cvode_mem->cv_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSstg, cvNlsLSetupSensStg);
  }
  else { retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSstg, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting the linear solver setup function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (cvode_mem->cv_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSstg, cvNlsLSolveSensStg);
  }
  else { retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSstg, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting linear solver solve function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(cvode_mem->NLSstg);

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INIT_FAIL);
    return (CV_NLS_INIT_FAIL);
  }

  return (CV_SUCCESS);
}